

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OneHotEncoder.pb.cc
# Opt level: O2

void __thiscall CoreML::Specification::OneHotEncoder::clear_CategoryType(OneHotEncoder *this)

{
  ulong uVar1;
  undefined8 *puVar2;
  StringVector *this_00;
  ulong uStack_20;
  
  if (this->_oneof_case_[0] == 2) {
    uVar1 = (this->super_MessageLite)._internal_metadata_.ptr_;
    puVar2 = (undefined8 *)(uVar1 & 0xfffffffffffffffc);
    if ((uVar1 & 1) != 0) {
      puVar2 = (undefined8 *)*puVar2;
    }
    if (puVar2 != (undefined8 *)0x0) goto LAB_002432d9;
    this_00 = (StringVector *)(this->CategoryType_).int64categories_;
    if (this_00 != (StringVector *)0x0) {
      Int64Vector::~Int64Vector((Int64Vector *)this_00);
    }
    uStack_20 = 0x28;
  }
  else {
    if (this->_oneof_case_[0] != 1) goto LAB_002432d9;
    uVar1 = (this->super_MessageLite)._internal_metadata_.ptr_;
    puVar2 = (undefined8 *)(uVar1 & 0xfffffffffffffffc);
    if ((uVar1 & 1) != 0) {
      puVar2 = (undefined8 *)*puVar2;
    }
    if (puVar2 != (undefined8 *)0x0) goto LAB_002432d9;
    this_00 = (this->CategoryType_).stringcategories_;
    if (this_00 != (StringVector *)0x0) {
      StringVector::~StringVector(this_00);
    }
    uStack_20 = 0x30;
  }
  operator_delete(this_00,uStack_20);
LAB_002432d9:
  this->_oneof_case_[0] = 0;
  return;
}

Assistant:

void OneHotEncoder::clear_CategoryType() {
// @@protoc_insertion_point(one_of_clear_start:CoreML.Specification.OneHotEncoder)
  switch (CategoryType_case()) {
    case kStringCategories: {
      if (GetArenaForAllocation() == nullptr) {
        delete CategoryType_.stringcategories_;
      }
      break;
    }
    case kInt64Categories: {
      if (GetArenaForAllocation() == nullptr) {
        delete CategoryType_.int64categories_;
      }
      break;
    }
    case CATEGORYTYPE_NOT_SET: {
      break;
    }
  }
  _oneof_case_[0] = CATEGORYTYPE_NOT_SET;
}